

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlopl.cpp
# Opt level: O2

void __thiscall musicBlock::OPLplayNote(musicBlock *this,uint channel,uchar note,int volume)

{
  uint uVar1;
  OP2instrEntry *instrument;
  
  if (volume != 0) {
    instrument = getInstrument(this,channel,note);
    if (instrument != (OP2instrEntry *)0x0) {
      uVar1 = findFreeChannel(this,(uint)(channel == 0xf) * 2,channel,note);
      if (uVar1 != 0xffffffff) {
        occupyChannel(this,uVar1,channel,(uint)note,volume,instrument,'\0');
        if (((instrument->flags & 4) != 0) && (opl_singlevoice.Value == false)) {
          uVar1 = findFreeChannel(this,(uint)(channel == 0xf) * 2 + 1,channel,note);
          if (uVar1 != 0xffffffff) {
            occupyChannel(this,uVar1,channel,(uint)note,volume,instrument,'\x01');
          }
        }
      }
    }
    return;
  }
  OPLreleaseNote(this,channel,note);
  return;
}

Assistant:

void musicBlock::OPLplayNote(uint channel, uchar note, int volume)
{
	int i;
	struct OP2instrEntry *instr;

	if (volume == 0)
	{
		OPLreleaseNote (channel, note);
		return;
	}

	if ( (instr = getInstrument(channel, note)) == NULL )
		return;

	if ( (i = findFreeChannel((channel == PERCUSSION) ? 2 : 0, channel, note)) != -1)
	{
		occupyChannel(i, channel, note, volume, instr, 0);
		if ((instr->flags & FL_DOUBLE_VOICE) && !opl_singlevoice)
		{
			if ( (i = findFreeChannel((channel == PERCUSSION) ? 3 : 1, channel, note)) != -1)
				occupyChannel(i, channel, note, volume, instr, 1);
		}
	}
}